

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_4.cpp
# Opt level: O2

char * strdup(char *__s)

{
  size_t sVar1;
  char *pcVar2;
  size_t i;
  size_t sVar3;
  
  sVar1 = strlen(__s);
  pcVar2 = (char *)operator_new__(sVar1 + 1);
  for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
    pcVar2[sVar3] = __s[sVar3];
  }
  pcVar2[sVar1] = '\0';
  return pcVar2;
}

Assistant:

char* strdup(const char* s)
{
	size_t length = strlen(s);
	char* ss = new char[length + 1];
	for (size_t i = 0; i < length; ++i)
		ss[i] = s[i];
	ss[length] = '\0';
	return ss;
}